

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::POMDPXState>::Free
          (MemoryPool<despot::POMDPXState> *this,POMDPXState *obj)

{
  POMDPXState *obj_local;
  
  obj_local = obj;
  if ((obj->super_State).super_MemoryObject.allocated_ != false) {
    (obj->super_State).super_MemoryObject.allocated_ = false;
    std::vector<despot::POMDPXState_*,_std::allocator<despot::POMDPXState_*>_>::push_back
              (&this->freelist_,&obj_local);
    this->num_allocated_ = this->num_allocated_ + -1;
    return;
  }
  __assert_fail("obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x3b,
                "void despot::MemoryPool<despot::POMDPXState>::Free(T *) [T = despot::POMDPXState]")
  ;
}

Assistant:

void Free(T* obj) {
		assert(obj->IsAllocated());
		obj->ClearAllocated();
		freelist_.push_back(obj);
		num_allocated_--;
	}